

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool __thiscall ON_3dVector::operator>(ON_3dVector *this,ON_3dVector *v)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  
  dVar1 = this->x;
  dVar2 = v->x;
  bVar3 = 1;
  if (dVar1 <= dVar2) {
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      bVar3 = 0;
    }
    else if (this->y <= v->y) {
      bVar3 = -(v->z < this->z) & -(this->y == v->y);
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool ON_3dVector::operator>( const ON_3dVector& v ) const
{
  // dictionary order
  return ((x>v.x)?true:((x==v.x)?((y>v.y)?true:(y==v.y&&z>v.z)?true:false):false));
}